

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_test.cpp
# Opt level: O1

void __thiscall jhu::thrax::TreeTests_OneNode_Test::TestBody(TreeTests_OneNode_Test *this)

{
  bool bVar1;
  char *message;
  string_view line;
  AssertionResult gtest_ar;
  Tree t;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  Tree local_40;
  undefined8 local_28;
  size_t sStack_20;
  char *local_18;
  Node *pNStack_10;
  
  line._M_str = "(ROOT foo)";
  line._M_len = 10;
  readTree(&local_40,line);
  local_58.data_._0_4_ = 1;
  local_60.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_40.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_40.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
              _M_impl.super__Vector_impl_data._M_start >> 5);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_50,"1","t.size()",(int *)&local_58,(unsigned_long *)&local_60);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/tree_test.cpp"
               ,0x19,message);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60.ptr_ + 8))();
      }
      local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_28 = *(undefined8 *)
                local_40.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                _M_impl.super__Vector_impl_data._M_start;
    sStack_20 = ((local_40.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                  _M_impl.super__Vector_impl_data._M_start)->label)._M_len;
    local_18 = ((local_40.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                 _M_impl.super__Vector_impl_data._M_start)->label)._M_str;
    pNStack_10 = (local_40.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                  _M_impl.super__Vector_impl_data._M_start)->parent;
    anon_unknown_10::expectNode
              (0,1,"ROOT",(Node *)0x0,
               *local_40.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
      super__Vector_impl_data._M_start != (Node *)0x0) {
    operator_delete(local_40.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(TreeTests, OneNode) {
  auto t = readTree("(ROOT foo)");
  ASSERT_EQ(1, t.size());
  auto root = t.front();
  auto s = Span{0, 1};
  expectNode(0, 1, "ROOT", nullptr, root);
}